

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::substitute(Forth *this)

{
  bool bVar1;
  undefined1 uVar2;
  uint uVar3;
  uint dst;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  reference ppVar5;
  size_type sVar6;
  char *src;
  ForthStack<unsigned_int> *this_00;
  uint local_1e4;
  _Self local_178;
  _Self local_170;
  iterator foundIt;
  char *c;
  iterator __end3;
  iterator __begin3;
  string *__range3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  size_type local_c8;
  size_type nextPercent;
  size_type processEnd;
  int processedIt;
  int result;
  string keyUpper;
  string key;
  string Word2;
  undefined1 local_40 [8];
  string Word1;
  CAddr caddr1;
  uint length1;
  CAddr caddr2;
  uint length2;
  Forth *this_local;
  
  requireDStackDepth(this,4,"SUBSTITUTE");
  this_00 = &this->dStack;
  uVar3 = ForthStack<unsigned_int>::getTop(this_00);
  pop(this);
  dst = ForthStack<unsigned_int>::getTop(this_00);
  Word1.field_2._12_4_ = ForthStack<unsigned_int>::getTop(this_00,1);
  Word1.field_2._8_4_ = ForthStack<unsigned_int>::getTop(this_00,2);
  std::__cxx11::string::string((string *)local_40);
  moveFromDataSpace(this,(string *)local_40,Word1.field_2._8_4_,(ulong)(uint)Word1.field_2._12_4_);
  std::__cxx11::string::string((string *)(key.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(keyUpper.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&processedIt);
  processEnd._4_4_ = 0;
  processEnd._0_4_ = 0;
  nextPercent = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  do {
    if (nextPercent <= (ulong)(long)(int)processEnd) {
LAB_0011a50c:
      sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&key.field_2 + 8));
      if (uVar3 < sVar6) {
        processEnd._4_4_ = 0xffffffff;
      }
      else {
        pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&key.field_2 + 8);
        src = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                        (pbVar4);
        sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size(pbVar4);
        moveIntoDataSpace(this,dst,src,sVar6 & 0xffffffff);
        sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&key.field_2 + 8));
        ForthStack<unsigned_int>::setTop(&this->dStack,1,(uint)sVar6);
        ForthStack<unsigned_int>::setTop(&this->dStack,2,dst);
      }
      if ((int)processEnd._4_4_ < 0) {
        local_1e4 = 0xffffffff;
      }
      else {
        local_1e4 = processEnd._4_4_;
      }
      ForthStack<unsigned_int>::setTop(&this->dStack,local_1e4);
      std::__cxx11::string::~string((string *)&processedIt);
      std::__cxx11::string::~string((string *)(keyUpper.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(key.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_40);
      return;
    }
    local_c8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40,'%',(long)(int)processEnd);
    if (local_c8 == 0xffffffffffffffff) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 (long)(int)processEnd,nextPercent - (long)(int)processEnd);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&key.field_2 + 8),&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      goto LAB_0011a50c;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_108,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
               (long)(int)processEnd,local_c8 - (long)(int)processEnd);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&key.field_2 + 8),&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    processEnd._0_4_ = (int)local_c8 + 1;
    if (nextPercent <= (ulong)(long)(int)processEnd) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&key.field_2 + 8),"%");
      goto LAB_0011a50c;
    }
    local_c8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40,'%',(long)(int)processEnd);
    if (local_c8 == 0xffffffffffffffff) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&key.field_2 + 8),"%");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_128,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 (long)(int)processEnd,nextPercent - (long)(int)processEnd);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&key.field_2 + 8),&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      goto LAB_0011a50c;
    }
    if (local_c8 == (long)(int)processEnd) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&key.field_2 + 8),"%");
      processEnd._0_4_ = (int)processEnd + 1;
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range3,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 (long)(int)processEnd,local_c8 - (long)(int)processEnd);
      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&keyUpper.field_2 + 8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (pbVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &__range3);
      std::__cxx11::string::~string((string *)&__range3);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&processedIt,
                 pbVar4);
      __end3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               begin((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &processedIt);
      c = (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  end((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &processedIt);
      while( true ) {
        bVar1 = __gnu_cxx::
                operator==<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          (&__end3,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&c);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        foundIt._M_node =
             (_Base_ptr)
             __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end3);
        uVar2 = toupper_ascii((char)(foundIt._M_node)->_M_color);
        *(undefined1 *)&(foundIt._M_node)->_M_color = uVar2;
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end3);
      }
      local_170._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&this->replacesSubstitute,(key_type *)&processedIt);
      local_178._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(&this->replacesSubstitute);
      bVar1 = std::operator==(&local_170,&local_178);
      if (bVar1) {
        pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&key.field_2 + 8),"%");
        pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(pbVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&keyUpper.field_2 + 8));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (pbVar4,"%");
      }
      else {
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*(&local_170);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&key.field_2 + 8),&ppVar5->second);
        processEnd._4_4_ = processEnd._4_4_ + 1;
      }
      processEnd._0_4_ = (int)local_c8 + 1;
    }
  } while( true );
}

Assistant:

void substitute(){
			REQUIRE_DSTACK_DEPTH(4, "SUBSTITUTE");
			auto length2 = dStack.getTop(); pop();
			auto caddr2 = CADDR(dStack.getTop()); ;
			auto length1 = dStack.getTop(1); ;
			auto caddr1 = CADDR(dStack.getTop(2));; 
			std::string Word1{};
			moveFromDataSpace(Word1, caddr1, length1);
			std::string Word2{}, key{}, keyUpper{};
			auto result = 0;
			auto processedIt=0;
			auto processEnd=Word1.size();
			// start processing of Word1
			while(processedIt<processEnd){
				//auto nextPercent=std::find(processedIt,processEnd,'%');
				auto nextPercent=Word1.find('%',processedIt);
				if(nextPercent==std::string::npos){
					// copy chars to buffer and exit from loop
					Word2.append(Word1.substr(processedIt,processEnd-processedIt));
					break;	
				}
				// copy chars before percent char
				Word2.append(Word1.substr(processedIt,nextPercent-processedIt));
				processedIt=nextPercent+1;
				if(processedIt>=processEnd) {
					Word2.append("%");
					break;
				} 
				nextPercent=Word1.find('%',processedIt);
				if(nextPercent==std::string::npos){
					// unclosed percent chars - everything copied to the buffer
					 Word2.append("%");
					 Word2.append(Word1.substr(processedIt,processEnd-processedIt));
					 break;
				}
				if(nextPercent==processedIt){
					// two percents replaced by one percent
					Word2.append("%");
					++processedIt;
					continue;
				}
				key=Word1.substr(processedIt,nextPercent-processedIt);
				keyUpper=key;
				for(auto &c : keyUpper) c=toupper_ascii(c);
				auto foundIt=replacesSubstitute.find(keyUpper);
				if(foundIt==replacesSubstitute.end()){
					Word2.append("%").append(key).append("%");
				} else {
				 Word2.append((*foundIt).second);
				 ++result;
				}
				processedIt=nextPercent+1;
			}
			if(Word2.size()> length2) {
				result=-1;
			} else {
				moveIntoDataSpace( caddr2, Word2.c_str(), CELL(Word2.size()));
				dStack.setTop(1, CELL(Word2.size()) );
				dStack.setTop(2, CELL(caddr2) );

			}
			dStack.setTop((result < 0) ? -1 : result ); 
		}